

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall wasm::TypeUpdater::noteRecursiveRemoval(TypeUpdater *this,Expression *curr)

{
  Recurser local_f8;
  Expression *local_18;
  Expression *curr_local;
  TypeUpdater *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  noteRecursiveRemoval(wasm::Expression*)::Recurser::Recurser(wasm::TypeUpdater&,wasm::Expression__
            (&local_f8,this,curr);
  noteRecursiveRemoval::Recurser::~Recurser(&local_f8);
  return;
}

Assistant:

void noteRecursiveRemoval(Expression* curr) {
    struct Recurser
      : public PostWalker<Recurser, UnifiedExpressionVisitor<Recurser>> {
      TypeUpdater& parent;

      Recurser(TypeUpdater& parent, Expression* root) : parent(parent) {
        walk(root);
      }

      void visitExpression(Expression* curr) { parent.noteRemoval(curr); }
    };

    Recurser(*this, curr);
  }